

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O1

lws * lws_client_reset(lws **pwsi,int ssl,char *address,int port,char *path,char *host,char weak)

{
  lws *wsi;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *cisin [8];
  
  if (pwsi != (lws **)0x0) {
    uVar4 = (ulong)(uint)ssl;
    wsi = *pwsi;
    pcVar2 = lws_wsi_tag(wsi);
    _lws_log(0x10,"%s: %s: redir %d: %s\n","lws_client_reset",pcVar2,
             (ulong)(uint)(int)wsi->redirects,address);
    if (wsi->redirects == '\x04') {
      _lws_log(1,"%s: Too many redirects\n","lws_client_reset");
      return (lws *)0x0;
    }
    wsi->redirects = wsi->redirects + '\x01';
    if (*path == '/') {
      uVar3 = (ulong)(path[1] == '/');
    }
    else {
      uVar3 = 0;
    }
    cisin[3] = (char *)0x0;
    cisin[6] = (char *)0x0;
    cisin[7] = (char *)0x0;
    cisin[4] = (char *)0x0;
    cisin[5] = (char *)0x0;
    cisin[1] = path + uVar3;
    lVar5 = 0;
    cisin[0] = address;
    cisin[2] = host;
    do {
      pcVar2 = lws_hdr_simple_ptr(wsi,(uint)"\\X]^"[lVar5]);
      cisin[lVar5 + 3] = pcVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    cisin[7] = wsi->alpn;
    iVar1 = lws_client_stash_create(wsi,cisin);
    if (iVar1 == 0) {
      uVar3 = (ulong)(uint)port;
      if (port == 0) {
        _lws_log(8,"%s: forcing port 443\n","lws_client_reset");
        uVar4 = 1;
        uVar3 = 0x1bb;
      }
      wsi->c_port = (uint16_t)uVar3;
      wsi->flags = (uint)((int)uVar4 != 0) | wsi->flags & 0xfffffffeU;
      _lws_log(4,"%s: REDIRECT %s:%d, path=\'%s\', ssl = %d, alpn=\'%s\'\n","lws_client_reset",
               address,uVar3,path,uVar4,cisin[7]);
      if (*cisin[7] != '\0') {
        __remove_wsi_socket_from_fds(wsi);
        if (weak != '\0') {
          path = (char *)wsi->ws;
          wsi->ws = (_lws_websocket_related *)0x0;
        }
        __lws_reset_wsi(wsi);
        if (weak != '\0') {
          wsi->ws = (_lws_websocket_related *)path;
        }
        wsi->field_0x475 = wsi->field_0x475 | 2;
        wsi->field_0x476 = wsi->field_0x476 | 4;
        return *pwsi;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/client/client-http.c"
                    ,0x66d,
                    "struct lws *lws_client_reset(struct lws **, int, const char *, int, const char *, const char *, char)"
                   );
    }
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_reset(struct lws **pwsi, int ssl, const char *address, int port,
		 const char *path, const char *host, char weak)
{
	struct lws_context_per_thread *pt;
#if defined(LWS_ROLE_WS)
	struct _lws_websocket_related *ws;
#endif
	const char *cisin[CIS_COUNT];
	struct lws *wsi;
	size_t o;
	int n;

	if (!pwsi)
		return NULL;

	wsi = *pwsi;
	pt = &wsi->a.context->pt[(int)wsi->tsi];

	lwsl_debug("%s: %s: redir %d: %s\n", __func__, lws_wsi_tag(wsi),
			wsi->redirects, address);

	if (wsi->redirects == 4) {
		lwsl_err("%s: Too many redirects\n", __func__);
		return NULL;
	}
	wsi->redirects++;

	/*
	 * goal is to close our role part, close the sockfd, detach the ah
	 * but leave our wsi extant and still bound to whatever vhost it was
	 */

	o = path[0] == '/' && path[1] == '/';

	memset((char *)cisin, 0, sizeof(cisin));

	cisin[CIS_ADDRESS]	= address;
	cisin[CIS_PATH]		= path + o;
	cisin[CIS_HOST]		= host;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		cisin[n + 3] = lws_hdr_simple_ptr(wsi, hnames2[n]);

#if defined(LWS_WITH_TLS)
	cisin[CIS_ALPN]		= wsi->alpn;
#endif

	if (lws_client_stash_create(wsi, cisin))
		return NULL;

	if (!port) {
		lwsl_info("%s: forcing port 443\n", __func__);

		port = 443;
		ssl = 1;
	}

	wsi->c_port = (uint16_t)port;

	wsi->flags = (wsi->flags & (~LCCSCF_USE_SSL)) |
					(ssl ? LCCSCF_USE_SSL : 0);

	lwsl_notice("%s: REDIRECT %s:%d, path='%s', ssl = %d, alpn='%s'\n",
		    __func__, address, port, path, ssl, cisin[CIS_ALPN]);

	if (!cisin[CIS_ALPN][0])
		assert(0);

	lws_pt_lock(pt, __func__);
	__remove_wsi_socket_from_fds(wsi);
	lws_pt_unlock(pt);

#if defined(LWS_ROLE_WS)
	if (weak) {
		ws = wsi->ws;
		wsi->ws = NULL;
	}
#endif

	/*
	 * After this point we can't trust the incoming strings like address,
	 * path any more, since they may have been pointing into the old ah.
	 *
	 * We must use the copies in the wsi->stash instead if we want them.
	 */

	__lws_reset_wsi(wsi); /* detaches ah here */
#if defined(LWS_ROLE_WS)
	if (weak)
		wsi->ws = ws;
#endif
	wsi->client_pipeline = 1;

	/*
	 * Will complete at close flow
	 */

	wsi->close_is_redirect = 1;

	return *pwsi;
}